

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int add_link_attach_properties(LINK_HANDLE link,MAP_HANDLE user_defined_properties)

{
  MAP_RESULT MVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE key_00;
  AMQP_VALUE value_00;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_VALUE value;
  AMQP_VALUE key;
  size_t i;
  LOGGER_LOG l_1;
  size_t count;
  char **values;
  char **keys;
  LOGGER_LOG l;
  fields attach_properties;
  MAP_HANDLE pMStack_18;
  int result;
  MAP_HANDLE user_defined_properties_local;
  LINK_HANDLE link_local;
  
  pMStack_18 = user_defined_properties;
  user_defined_properties_local = (MAP_HANDLE)link;
  l = (LOGGER_LOG)amqpvalue_create_map();
  if ((AMQP_VALUE)l == (AMQP_VALUE)0x0) {
    keys = (char **)xlogging_get_log_function();
    if (keys != (char **)0x0) {
      (*(code *)keys)(0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"add_link_attach_properties",0x193,1,
                      "Failed to create the map for attach properties.");
    }
    attach_properties._4_4_ = 0x194;
  }
  else {
    MVar1 = Map_GetInternals(pMStack_18,&values,(char ***)&count,(size_t *)&l_1);
    if (MVar1 == MAP_OK) {
      attach_properties._4_4_ = 0;
      for (key = (AMQP_VALUE)0x0; key < l_1 && attach_properties._4_4_ == 0;
          key = (AMQP_VALUE)((long)&key->type + 1)) {
        key_00 = amqpvalue_create_symbol(values[(long)key]);
        if (key_00 == (AMQP_VALUE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"add_link_attach_properties",0x1ad,1,"Failed creating AMQP_VALUE For key %s."
                      ,values[(long)key]);
          }
          attach_properties._4_4_ = 0x1ae;
        }
        else {
          value_00 = amqpvalue_create_string(*(char **)(count + (long)key * 8));
          if (value_00 == (AMQP_VALUE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"add_link_attach_properties",0x1b4,1,
                        "Failed creating AMQP_VALUE For key %s value",values[(long)key]);
            }
            attach_properties._4_4_ = 0x1b5;
          }
          else {
            iVar2 = amqpvalue_set_map_value((AMQP_VALUE)l,key_00,value_00);
            if (iVar2 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"add_link_attach_properties",0x1bb,1,"Failed adding property %s to map",
                          values[(long)key]);
              }
              attach_properties._4_4_ = 0x1bc;
            }
            amqpvalue_destroy(value_00);
          }
          amqpvalue_destroy(key_00);
        }
      }
      if (attach_properties._4_4_ == 0) {
        iVar2 = link_set_attach_properties((LINK_HANDLE)user_defined_properties_local,(fields)l);
        if (iVar2 == 0) {
          attach_properties._4_4_ = 0;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"add_link_attach_properties",0x1ca,1,"Failed attaching properties to link");
          }
          attach_properties._4_4_ = 0x1cb;
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"add_link_attach_properties",0x19e,1,
                  "failed getting user defined properties details.");
      }
      attach_properties._4_4_ = 0x19f;
    }
    amqpvalue_destroy((AMQP_VALUE)l);
  }
  return attach_properties._4_4_;
}

Assistant:

static int add_link_attach_properties(LINK_HANDLE link, MAP_HANDLE user_defined_properties)
{
    int result;
    fields attach_properties;

    if ((attach_properties = amqpvalue_create_map()) == NULL)
    {
        LogError("Failed to create the map for attach properties.");
        result = MU_FAILURE;
    }
    else
    {
        const char* const* keys;
        const char* const* values;
        size_t count;

        if (Map_GetInternals(user_defined_properties, &keys, &values, &count) != MAP_OK)
        {
            LogError("failed getting user defined properties details.");
            result = MU_FAILURE;
        }
        else
        {
            size_t i;
            result = RESULT_OK;

            for (i = 0; i < count && result == RESULT_OK; i++)
            {
                AMQP_VALUE key;
                AMQP_VALUE value;

                if ((key = amqpvalue_create_symbol(keys[i])) == NULL)
                {
                    LogError("Failed creating AMQP_VALUE For key %s.", keys[i]);
                    result = MU_FAILURE;
                }
                else
                {
                    if ((value = amqpvalue_create_string(values[i])) == NULL)
                    {
                        LogError("Failed creating AMQP_VALUE For key %s value", keys[i]);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_set_map_value(attach_properties, key, value) != 0)
                        {
                            LogError("Failed adding property %s to map", keys[i]);
                            result = MU_FAILURE;
                        }

                        amqpvalue_destroy(value);
                    }

                    amqpvalue_destroy(key);
                }
            }

            if (result == RESULT_OK)
            {
                if (link_set_attach_properties(link, attach_properties) != 0)
                {
                    LogError("Failed attaching properties to link");
                    result = MU_FAILURE;
                }
                else
                {
                    result = RESULT_OK;
                }
            }
        }

        amqpvalue_destroy(attach_properties);
    }

    return result;
}